

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

string * __thiscall cmSourceFile::GetFullPath(cmSourceFile *this,string *error)

{
  bool bVar1;
  ulong uVar2;
  string *error_local;
  cmSourceFile *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) && (bVar1 = FindFullPath(this,error), bVar1)) {
    CheckExtension(this);
  }
  return &this->FullPath;
}

Assistant:

std::string const& cmSourceFile::GetFullPath(std::string* error)
{
  if(this->FullPath.empty())
    {
    if(this->FindFullPath(error))
      {
      this->CheckExtension();
      }
    }
  return this->FullPath;
}